

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_is_eq(FIOBJ self,FIOBJ other)

{
  int iVar1;
  FIOBJ other_local;
  FIOBJ self_local;
  
  iVar1 = fio_str_iseq((fio_str_s_conflict *)((self & 0xfffffffffffffff8) + 0x10),
                       (fio_str_s_conflict *)((other & 0xfffffffffffffff8) + 0x10));
  return (long)iVar1;
}

Assistant:

static size_t fiobj_str_is_eq(const FIOBJ self, const FIOBJ other) {
  return fio_str_iseq(&obj2str(self)->str, &obj2str(other)->str);
}